

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Reader capnp::_::anon_unknown_129::name(DynamicEnum e)

{
  ArrayPtr<const_char> AVar1;
  Maybe<capnp::EnumSchema::Enumerant> local_60;
  DynamicEnum local_18;
  
  DynamicEnum::getEnumerant(&local_60,&local_18);
  if (local_60.ptr.isSet == true) {
    if (local_60.ptr.field_1.value.proto._reader.pointerCount == 0) {
      local_60.ptr.field_1.value.proto._reader.capTable = (CapTableReader *)(RawBrandedSchema *)0x0;
      local_60.ptr.field_1.value.proto._reader.nestingLimit = 0x7fffffff;
      local_60.ptr.field_1.value.proto._reader.pointers = (WirePointer *)0x0;
      local_60.ptr._0_8_ = (SegmentReader *)0x0;
    }
    else {
      local_60.ptr._0_8_ = CONCAT44(local_60.ptr.field_1._20_4_,local_60.ptr.field_1._16_4_);
    }
    local_60.ptr.field_1.value.parent.super_Schema.raw =
         (EnumSchema)local_60.ptr.field_1.value.proto._reader.capTable;
    local_60.ptr.field_1._8_8_ = local_60.ptr.field_1.value.proto._reader.pointers;
    local_60.ptr.field_1._16_4_ = local_60.ptr.field_1.value.proto._reader.nestingLimit;
    AVar1 = (ArrayPtr<const_char>)
            PointerReader::getBlob<capnp::Text>((PointerReader *)&local_60,(void *)0x0,0);
  }
  else {
    AVar1.size_ = 0x14;
    AVar1.ptr = "(unknown enumerant)";
  }
  return (StringPtr)(StringPtr)AVar1;
}

Assistant:

Text::Reader name(DynamicEnum e) {
  KJ_IF_MAYBE(schema, e.getEnumerant()) {
    return schema->getProto().getName();
  } else {
    return "(unknown enumerant)";
  }
}